

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int bLevel,bool allow_trail_saving)

{
  double dVar1;
  decision_heuristic dVar2;
  Lit *pLVar3;
  VarData *pVVar4;
  double *pdVar5;
  Heap<Minisat::Solver::VarOrderLt> *pHVar6;
  bool bVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  Lit *pLVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  
  if (bLevel < (this->trail_lim).sz) {
    reset_old_trail(this);
    if (allow_trail_saving) {
      if (this->use_backuped_trail == true) {
        bVar7 = 1 < (this->trail_lim).sz - bLevel;
      }
      else {
        bVar7 = false;
      }
    }
    else {
      bVar7 = false;
    }
    if ((this->add_tmp).data != (Lit *)0x0) {
      (this->add_tmp).sz = 0;
    }
    iVar14 = (this->trail).sz;
    lVar13 = (long)iVar14;
    piVar8 = (this->trail_lim).data;
    iVar10 = piVar8[bLevel];
    if (iVar10 < iVar14) {
      lVar11 = lVar13 * 4;
      do {
        lVar13 = lVar13 + -1;
        pLVar3 = (this->trail).data;
        pVVar4 = (this->vardata).data;
        pLVar12 = (Lit *)((long)&pLVar3[-1].x + lVar11);
        iVar14 = *(int *)((long)&pLVar3[-1].x + lVar11) >> 1;
        if (bLevel < pVVar4[iVar14].level) {
          if (bVar7) {
            iVar10 = (this->old_trail).sz;
            (this->old_trail).sz = iVar10 + 1;
            (this->old_trail).data[iVar10].x = pLVar12->x;
            (this->oldreasons).data[iVar14] = pVVar4[iVar14].reason;
          }
          dVar2 = this->current_heuristic;
          if ((VSIDS_DISTANCE < dVar2) &&
             (uVar9 = (int)this->conflicts - (this->picked).data[iVar14], uVar9 != 0)) {
            pdVar5 = (this->activity_CHB).data;
            dVar1 = pdVar5[iVar14];
            dVar15 = ((double)((this->almost_conflicted).data[iVar14] +
                              (this->conflicted).data[iVar14]) / (double)uVar9) * this->step_size +
                     (1.0 - this->step_size) * dVar1;
            pdVar5[iVar14] = dVar15;
            if ((dVar2 == CHB) &&
               ((pHVar6 = this->order_heap, iVar14 < (pHVar6->indices).sz &&
                (-1 < (pHVar6->indices).data[iVar14])))) {
              iVar10 = (pHVar6->indices).data[iVar14];
              if (dVar15 <= dVar1) {
                Heap<Minisat::Solver::VarOrderLt>::percolateDown(pHVar6,iVar10);
              }
              else {
                Heap<Minisat::Solver::VarOrderLt>::percolateUp(pHVar6,iVar10);
              }
            }
          }
          (this->canceled).data[iVar14] = (uint)this->conflicts;
          (this->assigns).data[iVar14].value = '\x02';
          if ((1 < this->phase_saving) ||
             ((this->phase_saving == 1 &&
              ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar13)))) {
            (this->polarity).data[iVar14] = *(byte *)((long)&(this->trail).data[-1].x + lVar11) & 1;
          }
          pHVar6 = this->order_heap;
          if ((((pHVar6->indices).sz <= iVar14) || ((pHVar6->indices).data[iVar14] < 0)) &&
             ((this->decision).data[iVar14] != '\0')) {
            Heap<Minisat::Solver::VarOrderLt>::insert(pHVar6,iVar14);
          }
        }
        else {
          vec<Minisat::Lit>::push(&this->add_tmp,pLVar12);
        }
        piVar8 = (this->trail_lim).data;
        iVar10 = piVar8[bLevel];
        lVar11 = lVar11 + -4;
      } while (iVar10 < lVar13);
    }
    this->qhead = iVar10;
    if (piVar8[bLevel] < (this->trail).sz) {
      (this->trail).sz = piVar8[bLevel];
    }
    if (bLevel < (this->trail_lim).sz) {
      (this->trail_lim).sz = bLevel;
    }
    lVar13 = (long)(this->add_tmp).sz;
    if (0 < lVar13) {
      pLVar3 = (this->add_tmp).data;
      pLVar12 = (this->trail).data;
      lVar13 = lVar13 + 1;
      do {
        iVar14 = (this->trail).sz;
        (this->trail).sz = iVar14 + 1;
        pLVar12[iVar14].x = pLVar3[lVar13 + -2].x;
        lVar13 = lVar13 + -1;
      } while (1 < lVar13);
    }
    if ((this->add_tmp).data != (Lit *)0x0) {
      (this->add_tmp).sz = 0;
    }
    if (bVar7) {
      lVar13 = (long)(this->old_trail).sz;
      if (1 < lVar13) {
        pLVar3 = (this->old_trail).data;
        lVar11 = 0;
        lVar13 = lVar13 + -2;
        do {
          iVar14 = pLVar3[lVar11].x;
          pLVar3[lVar11].x = pLVar3[lVar13 + 1].x;
          lVar11 = lVar11 + 1;
          pLVar3[lVar13 + 1].x = iVar14;
          bVar7 = lVar11 < lVar13;
          lVar13 = lVar13 + -1;
        } while (bVar7);
      }
      this->backuped_trail_lits = this->backuped_trail_lits + (long)(this->old_trail).sz;
    }
  }
  return;
}

Assistant:

void Solver::cancelUntil(int bLevel, bool allow_trail_saving)
{

    if (decisionLevel() > bLevel) {
        TRACE(std::cout << "c backtrack to " << bLevel << std::endl);

        reset_old_trail();

        bool savetrail = allow_trail_saving && use_backuped_trail && (decisionLevel() - bLevel > 1);

        add_tmp.clear();
        for (int c = trail.size() - 1; c >= trail_lim[bLevel]; c--) {
            Var x = var(trail[c]);

            if (level(x) <= bLevel) {
                add_tmp.push(trail[c]);
                continue;
            }
            if (savetrail) {
                old_trail.push_(trail[c]); /* we traverse trail in reverse order */
                oldreasons[x] = reason(x);
            }

            if (!usesVSIDS()) {
                uint32_t age = conflicts - picked[x];
                if (age > 0) {
                    double adjusted_reward = ((double)(conflicted[x] + almost_conflicted[x])) / ((double)age);
                    double old_activity = activity_CHB[x];
                    activity_CHB[x] = step_size * adjusted_reward + ((1 - step_size) * old_activity);
                    if (usesCHB() && order_heap->inHeap(x)) {
                        if (activity_CHB[x] > old_activity)
                            order_heap->decrease(x);
                        else
                            order_heap->increase(x);
                    }
                }
            }
#ifdef ANTI_EXPLORATION
            canceled[x] = conflicts;
#endif

            assigns[x] = l_Undef;
#ifdef PRINT_OUT
            std::cout << "undo " << x << "\n";
#endif
            if (phase_saving > 1 || ((phase_saving == 1) && c > trail_lim.last())) polarity[x] = sign(trail[c]);
            insertVarOrder(x);
        }
        qhead = trail_lim[bLevel];
        trail.shrink(trail.size() - trail_lim[bLevel]);
        trail_lim.shrink(trail_lim.size() - bLevel);
        for (int nLitId = add_tmp.size() - 1; nLitId >= 0; --nLitId) {
            trail.push_(add_tmp[nLitId]);
        }

        add_tmp.clear();

        /* reverse saved trail, as we added elements in reverse order as well */
        if (savetrail) {
            int i = 0, j = old_trail.size() - 1;
            while (i < j) {
                const Lit l = old_trail[i];
                old_trail[i++] = old_trail[j];
                old_trail[j--] = l;
            }
            backuped_trail_lits += old_trail.size();
        }
    }
}